

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int doputon(obj *otmp)

{
  boolean bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char local_a8 [7];
  char answer;
  char qbuf [128];
  long local_20;
  long mask;
  obj *otmp_local;
  
  local_20 = 0;
  if ((otmp == (obj *)0x0) ||
     (bVar1 = validate_object(otmp,"\x03\x04\x05\x06\a","put on"), bVar1 != '\0')) {
    mask = (long)otmp;
    if (otmp == (obj *)0x0) {
      mask = (long)getobj("\x03\x04\x05\x06\a","put on",(obj **)0x0);
    }
    if (mask == 0) {
      otmp_local._4_4_ = 0;
    }
    else if (*(char *)(mask + 0x35) == '\x03') {
      otmp_local._4_4_ = dowear((obj *)mask);
    }
    else if ((*(uint *)(mask + 0x60) & 0xf0000) == 0) {
      iVar3 = welded((obj *)mask);
      if (iVar3 == 0) {
        if ((obj *)mask == uwep) {
          setuwep((obj *)0x0);
        }
        if ((obj *)mask == uswapwep) {
          setuswapwep((obj *)0x0);
        }
        if ((obj *)mask == uquiver) {
          setuqwep((obj *)0x0);
        }
        if ((*(char *)(mask + 0x35) == '\x04') || (*(short *)(mask + 0x2a) == 0x113)) {
          if (((youmonst.data)->mflags1 & 0x6000) == 0x6000) {
            pline("You cannot make the ring stick to your body.");
            return 0;
          }
          if ((uleft != (obj *)0x0) && (uright != (obj *)0x0)) {
            pcVar4 = "";
            if (((youmonst.data)->mflags1 & 0x20000) != 0) {
              pcVar4 = "ring-";
            }
            pcVar5 = body_part(3);
            pcVar5 = makeplural(pcVar5);
            pline("There are no more %s%s to fill.",pcVar4,pcVar5);
            return 0;
          }
          if (uleft == (obj *)0x0) {
            if (uright == (obj *)0x0) {
              do {
                pcVar4 = "";
                if (((youmonst.data)->mflags1 & 0x20000) != 0) {
                  pcVar4 = "ring-";
                }
                pcVar5 = body_part(3);
                sprintf(local_a8,"Which %s%s, Right or Left?",pcVar4,pcVar5);
                cVar2 = yn_function(local_a8,"rl",'\0');
                if (cVar2 == '\0') {
                  return 0;
                }
                switch(cVar2) {
                case 'L':
                case 'l':
                  local_20 = 0x20000;
                  break;
                case 'R':
                case 'r':
                  local_20 = 0x40000;
                }
              } while (local_20 == 0);
            }
            else {
              local_20 = 0x20000;
            }
          }
          else {
            local_20 = 0x40000;
          }
          if ((uarmg != (obj *)0x0) && ((*(uint *)&uarmg->field_0x4a & 1) != 0)) {
            *(uint *)&uarmg->field_0x4a = *(uint *)&uarmg->field_0x4a & 0xffffffbf | 0x40;
            pline("You cannot remove your gloves to put on the ring.");
            return 0;
          }
          iVar3 = welded(uwep);
          if ((iVar3 != 0) &&
             (((uwep->oclass == '\x02' || (uwep->oclass == '\x06')) &&
              ((*(ushort *)&objects[uwep->otyp].field_0x11 & 1) != 0)))) {
            pline("You cannot free your weapon hands to put on the ring.");
            return 0;
          }
          iVar3 = welded(uwep);
          if ((iVar3 != 0) && (local_20 == 0x40000)) {
            pline("You cannot free your weapon hand to put on the ring.");
            return 0;
          }
          if ((*(char *)(mask + 0x37) != '\0') &&
             (iVar3 = touch_artifact((obj *)mask,&youmonst), iVar3 == 0)) {
            return 1;
          }
          setworn((obj *)mask,local_20);
          Ring_on((obj *)mask,'\x01');
        }
        else {
          if (*(char *)(mask + 0x35) != '\x05') {
            if (ublindf != (obj *)0x0) {
              if (ublindf->otyp == 0xef) {
                pcVar4 = body_part(2);
                pline("Your %s is already covered by a towel.",pcVar4);
              }
              else if (ublindf->otyp == 0xee) {
                if (*(short *)(mask + 0x2a) == 0xed) {
                  already_wearing2("lenses","a blindfold");
                }
                else {
                  already_wearing("a blindfold");
                }
              }
              else if (ublindf->otyp == 0xed) {
                if (*(short *)(mask + 0x2a) == 0xee) {
                  already_wearing2("a blindfold","some lenses");
                }
                else {
                  already_wearing("some lenses");
                }
              }
              else {
                already_wearing("something");
              }
              return 0;
            }
            if (((*(short *)(mask + 0x2a) != 0xee) && (*(short *)(mask + 0x2a) != 0xef)) &&
               (*(short *)(mask + 0x2a) != 0xed)) {
              pline("You can\'t wear that!");
              return 0;
            }
            if ((*(char *)(mask + 0x37) != '\0') &&
               (iVar3 = touch_artifact((obj *)mask,&youmonst), iVar3 == 0)) {
              return 1;
            }
            Blindf_on((obj *)mask);
            return 1;
          }
          if (uamul != (obj *)0x0) {
            already_wearing("an amulet");
            return 0;
          }
          if ((*(char *)(mask + 0x37) != '\0') &&
             (iVar3 = touch_artifact((obj *)mask,&youmonst), iVar3 == 0)) {
            return 1;
          }
          setworn((obj *)mask,0x10000);
          if (*(short *)(mask + 0x2a) == 0xce) {
            Amulet_on();
            return 1;
          }
          Amulet_on();
        }
        otmp_local._4_4_ = 1;
      }
      else {
        weldmsg((obj *)mask);
        otmp_local._4_4_ = 0;
      }
    }
    else {
      already_wearing("that");
      otmp_local._4_4_ = 0;
    }
  }
  else {
    otmp_local._4_4_ = 0;
  }
  return otmp_local._4_4_;
}

Assistant:

int doputon(struct obj *otmp)
{
	long mask = 0L;

	if (otmp && !validate_object(otmp, clothes_and_accessories, "put on"))
		return 0;
	else if (!otmp)
		otmp = getobj(clothes_and_accessories, "put on", NULL);
	if (!otmp) return 0;
        if (otmp->oclass == ARMOR_CLASS) return dowear(otmp);

	if (otmp->owornmask & (W_RING | W_AMUL | W_TOOL)) {
		already_wearing(c_that_);
		return 0;
	}
	if (welded(otmp)) {
		weldmsg(otmp);
		return 0;
	}
	if (otmp == uwep)
		setuwep(NULL);
	if (otmp == uswapwep)
		setuswapwep(NULL);
	if (otmp == uquiver)
		setuqwep(NULL);
	if (otmp->oclass == RING_CLASS || otmp->otyp == MEAT_RING) {
		if (nolimbs(youmonst.data)) {
			pline("You cannot make the ring stick to your body.");
			return 0;
		}
		if (uleft && uright){
			pline("There are no more %s%s to fill.",
				humanoid(youmonst.data) ? "ring-" : "",
				makeplural(body_part(FINGER)));
			return 0;
		}
		if (uleft) mask = RIGHT_RING;
		else if (uright) mask = LEFT_RING;
		else do {
			char qbuf[QBUFSZ];
			char answer;

			sprintf(qbuf, "Which %s%s, Right or Left?",
				humanoid(youmonst.data) ? "ring-" : "",
				body_part(FINGER));
			if (!(answer = yn_function(qbuf, "rl", '\0')))
				return 0;
			switch(answer){
			case 'l':
			case 'L':
				mask = LEFT_RING;
				break;
			case 'r':
			case 'R':
				mask = RIGHT_RING;
				break;
			}
		} while (!mask);
		if (uarmg && uarmg->cursed) {
			uarmg->bknown = TRUE;
		    pline("You cannot remove your gloves to put on the ring.");
			return 0;
		}
		if (welded(uwep) && bimanual(uwep)) {
			/* welded will set bknown */
	    pline("You cannot free your weapon hands to put on the ring.");
			return 0;
		}
		if (welded(uwep) && mask==RIGHT_RING) {
			/* welded will set bknown */
	    pline("You cannot free your weapon hand to put on the ring.");
			return 0;
		}
		if (otmp->oartifact && !touch_artifact(otmp, &youmonst))
		    return 1; /* costs a turn even though it didn't get worn */
		setworn(otmp, mask);
		Ring_on(otmp, TRUE);
	} else if (otmp->oclass == AMULET_CLASS) {
		if (uamul) {
			already_wearing("an amulet");
			return 0;
		}
		if (otmp->oartifact && !touch_artifact(otmp, &youmonst))
		    return 1;
		setworn(otmp, W_AMUL);
		if (otmp->otyp == AMULET_OF_CHANGE) {
			Amulet_on();
			/* Don't do a prinv() since the amulet is now gone */
			return 1;
		}
		Amulet_on();
	} else {	/* it's a blindfold, towel, or lenses */
		if (ublindf) {
			if (ublindf->otyp == TOWEL)
				pline("Your %s is already covered by a towel.",
					body_part(FACE));
			else if (ublindf->otyp == BLINDFOLD) {
				if (otmp->otyp == LENSES)
					already_wearing2("lenses", "a blindfold");
				else
					already_wearing("a blindfold");
			} else if (ublindf->otyp == LENSES) {
				if (otmp->otyp == BLINDFOLD)
					already_wearing2("a blindfold", "some lenses");
				else
					already_wearing("some lenses");
			} else
				already_wearing("something"); /* ??? */
			return 0;
		}
		if (otmp->otyp != BLINDFOLD && otmp->otyp != TOWEL && otmp->otyp != LENSES) {
			pline("You can't wear that!");
			return 0;
		}
		if (otmp->oartifact && !touch_artifact(otmp, &youmonst))
		    return 1;
		Blindf_on(otmp);
		return 1;
	}
	return 1;
}